

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raster.cpp
# Opt level: O2

void rw::compressPal4(uint8 *dst,uint32 dststride,uint8 *src,uint32 srcstride,int32 w,int32 h)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  
  uVar3 = (long)w / 2 & 0xffffffff;
  uVar4 = 0;
  if ((int)((long)w / 2) < 1) {
    uVar3 = 0;
  }
  if (h < 1) {
    h = 0;
  }
  uVar5 = 1;
  for (iVar6 = 0; uVar7 = uVar3, uVar1 = uVar4, uVar2 = uVar5, iVar6 != h; iVar6 = iVar6 + 1) {
    while( true ) {
      if (uVar7 == 0) break;
      dst[uVar1] = src[uVar2] << 4 | src[uVar2 - 1];
      uVar7 = uVar7 - 1;
      uVar1 = uVar1 + 1;
      uVar2 = uVar2 + 2;
    }
    uVar5 = uVar5 + srcstride;
    uVar4 = uVar4 + dststride;
  }
  return;
}

Assistant:

void
compressPal4(uint8 *dst, uint32 dststride, uint8 *src, uint32 srcstride, int32 w, int32 h)
{
	int32 x, y;
	for(y = 0; y < h; y++)
		for(x = 0; x < w/2; x++)
			dst[y*dststride + x] = src[y*srcstride + x*2 + 0] | src[y*srcstride + x*2 + 1] << 4;
}